

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_throw(lua_State *L,int errcode)

{
  global_State *pgVar1;
  StkId pSVar2;
  long lVar3;
  int errcode_00;
  TValue *io2;
  TValue *io1;
  global_State *g;
  int errcode_local;
  lua_State *L_local;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    longjmp((__jmp_buf_tag *)L->errorJmp->b,1);
  }
  pgVar1 = L->l_G;
  errcode_00 = luaE_resetthread(L,errcode);
  if (pgVar1->mainthread->errorJmp != (lua_longjmp *)0x0) {
    pSVar2 = (pgVar1->mainthread->top).p;
    (pgVar1->mainthread->top).p = pSVar2 + 1;
    lVar3 = (L->top).offset;
    (pSVar2->val).value_ = *(Value *)(lVar3 + -0x10);
    (pSVar2->val).tt_ = *(lu_byte *)(lVar3 + -8);
    luaD_throw(pgVar1->mainthread,errcode_00);
  }
  if (pgVar1->panic != (lua_CFunction)0x0) {
    (*pgVar1->panic)(L);
  }
  abort();
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
    errcode = luaE_resetthread(L, errcode);  /* close all upvalues */
    if (g->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, g->mainthread->top.p++, L->top.p - 1);  /* copy error obj. */
      luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}